

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::LayerNorm_x86::forward_inplace(LayerNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  float *pfVar5;
  float *pfVar6;
  void *pvVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  int iVar22;
  ulong uVar23;
  int q;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  float *pfVar28;
  float *pfVar29;
  int i;
  ulong uVar30;
  float _mean;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  float _a;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128 _b_128;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  iVar1 = bottom_top_blob->elempack;
  iVar24 = bottom_top_blob->dims;
  iVar22 = bottom_top_blob->w;
  pp_Var3 = this->_vptr_LayerNorm_x86;
  p_Var4 = pp_Var3[-3];
  pfVar5 = *(float **)(&this->field_0xe0 + (long)p_Var4);
  pfVar6 = *(float **)(&this->field_0x128 + (long)p_Var4);
  if (iVar24 == 1) {
    iVar22 = iVar22 * iVar1;
    pvVar7 = bottom_top_blob->data;
    fVar31 = 0.0;
    fVar32 = 0.0;
    auVar37._0_4_ = 0.0;
    auVar33._0_4_ = 0.0;
    for (lVar27 = 0; (int)lVar27 + 4 <= iVar22; lVar27 = lVar27 + 4) {
      pfVar19 = (float *)((long)pvVar7 + lVar27 * 4);
      fVar31 = fVar31 + *pfVar19;
      fVar32 = fVar32 + pfVar19[1];
      auVar37._0_4_ = auVar37._0_4_ + pfVar19[2];
      auVar33._0_4_ = auVar33._0_4_ + pfVar19[3];
    }
    auVar39._0_4_ = 0.0;
    for (; (int)lVar27 < iVar22; lVar27 = lVar27 + 1) {
      auVar39._0_4_ = auVar39._0_4_ + *(float *)((long)pvVar7 + lVar27 * 4);
    }
    fVar31 = (auVar33._0_4_ + fVar32 + auVar37._0_4_ + fVar31 + auVar39._0_4_) / (float)iVar22;
    fVar32 = 0.0;
    auVar37._0_4_ = 0.0;
    auVar33._0_4_ = 0.0;
    auVar39._0_4_ = 0.0;
    for (lVar27 = 0; (int)lVar27 + 4 <= iVar22; lVar27 = lVar27 + 4) {
      pfVar19 = (float *)((long)pvVar7 + lVar27 * 4);
      fVar32 = fVar32 + (*pfVar19 - fVar31) * (*pfVar19 - fVar31);
      auVar37._0_4_ = auVar37._0_4_ + (pfVar19[1] - fVar31) * (pfVar19[1] - fVar31);
      auVar33._0_4_ = auVar33._0_4_ + (pfVar19[2] - fVar31) * (pfVar19[2] - fVar31);
      auVar39._0_4_ = auVar39._0_4_ + (pfVar19[3] - fVar31) * (pfVar19[3] - fVar31);
    }
    auVar36._0_4_ = 0.0;
    for (; (int)lVar27 < iVar22; lVar27 = lVar27 + 1) {
      auVar41._0_4_ = *(float *)((long)pvVar7 + lVar27 * 4) - fVar31;
      auVar36._0_4_ = auVar36._0_4_ + auVar41._0_4_ * auVar41._0_4_;
    }
    auVar39._0_4_ = auVar39._0_4_ + auVar37._0_4_;
    auVar37._0_4_ =
         (auVar39._0_4_ + auVar33._0_4_ + fVar32 + auVar36._0_4_) / (float)iVar22 +
         *(float *)(&this->field_0xd4 + (long)p_Var4);
    auVar40._4_4_ = auVar39._0_4_;
    auVar40._0_4_ = auVar37._0_4_;
    auVar40._8_4_ = auVar39._0_4_;
    auVar40._12_4_ = auVar39._0_4_;
    auVar33 = rsqrtss(ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)p_Var4)),auVar40);
    fVar32 = auVar33._0_4_;
    fVar32 = fVar32 * -0.5 * (auVar37._0_4_ * fVar32 * fVar32 + -3.0);
    fVar31 = -fVar31 * fVar32;
    if (*(int *)(&this->field_0xd8 + (long)p_Var4) == 0) {
      for (lVar27 = 0; (int)lVar27 + 4 <= iVar22; lVar27 = lVar27 + 4) {
        pfVar5 = (float *)((long)pvVar7 + lVar27 * 4);
        auVar37._0_4_ = pfVar5[1];
        auVar33._0_4_ = pfVar5[2];
        auVar39._0_4_ = pfVar5[3];
        pfVar6 = (float *)((long)pvVar7 + lVar27 * 4);
        *pfVar6 = *pfVar5 * fVar32 + fVar31;
        pfVar6[1] = auVar37._0_4_ * fVar32 + fVar31;
        pfVar6[2] = auVar33._0_4_ * fVar32 + fVar31;
        pfVar6[3] = auVar39._0_4_ * fVar32 + fVar31;
      }
      for (; (int)lVar27 < iVar22; lVar27 = lVar27 + 1) {
        *(float *)((long)pvVar7 + lVar27 * 4) =
             *(float *)((long)pvVar7 + lVar27 * 4) * fVar32 + fVar31;
      }
    }
    else {
      for (lVar27 = 0; (int)lVar27 + 4 <= iVar22; lVar27 = lVar27 + 4) {
        pfVar19 = (float *)((long)pvVar7 + lVar27 * 4);
        auVar37._0_4_ = pfVar19[1];
        auVar33._0_4_ = pfVar19[2];
        auVar39._0_4_ = pfVar19[3];
        pfVar20 = pfVar5 + lVar27;
        auVar36._0_4_ = pfVar20[1];
        auVar41._0_4_ = pfVar20[2];
        auVar33._4_4_ = pfVar20[3];
        pfVar29 = pfVar6 + lVar27;
        auVar33._8_4_ = pfVar29[1];
        auVar33._12_4_ = pfVar29[2];
        auVar41._4_4_ = pfVar29[3];
        pfVar17 = (float *)((long)pvVar7 + lVar27 * 4);
        *pfVar17 = (*pfVar19 * fVar32 + fVar31) * *pfVar20 + *pfVar29;
        pfVar17[1] = (auVar37._0_4_ * fVar32 + fVar31) * auVar36._0_4_ + auVar33._8_4_;
        pfVar17[2] = (auVar33._0_4_ * fVar32 + fVar31) * auVar41._0_4_ + auVar33._12_4_;
        pfVar17[3] = (auVar39._0_4_ * fVar32 + fVar31) * auVar33._4_4_ + auVar41._4_4_;
      }
      for (; (int)lVar27 < iVar22; lVar27 = lVar27 + 1) {
        *(float *)((long)pvVar7 + lVar27 * 4) =
             (*(float *)((long)pvVar7 + lVar27 * 4) * fVar32 + fVar31) * pfVar5[lVar27] +
             pfVar6[lVar27];
      }
    }
  }
  else {
    uVar2 = bottom_top_blob->h;
    if (iVar24 == 3) {
      uVar25 = 0;
      uVar18 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar18 = uVar25;
      }
      if (*(int *)(&this->field_0xd0 + (long)p_Var4) == iVar22) {
        iVar24 = iVar22 * iVar1;
        fVar31 = 1.0 / (float)iVar22;
        uVar23 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar23 = uVar25;
        }
        for (; uVar25 != uVar18; uVar25 = uVar25 + 1) {
          pp_Var3 = this->_vptr_LayerNorm_x86;
          for (uVar30 = 0; uVar30 != uVar23; uVar30 = uVar30 + 1) {
            pvVar7 = bottom_top_blob->data;
            sVar8 = bottom_top_blob->elemsize;
            lVar16 = bottom_top_blob->cstep * uVar25;
            lVar27 = (long)bottom_top_blob->w * uVar30;
            pfVar20 = (float *)((long)pvVar7 + lVar27 * sVar8 + lVar16 * sVar8);
            fVar32 = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
            lVar26 = 0;
            auVar33._0_4_ = 0.0;
            auVar39._0_4_ = 0.0;
            auVar36._0_4_ = 0.0;
            auVar37._0_4_ = 0.0;
            iVar22 = 0;
            pfVar19 = pfVar20;
            while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
              auVar33._0_4_ = auVar33._0_4_ + *pfVar19;
              auVar39._0_4_ = auVar39._0_4_ + pfVar19[1];
              auVar36._0_4_ = auVar36._0_4_ + pfVar19[2];
              auVar37._0_4_ = auVar37._0_4_ + pfVar19[3];
              pfVar19 = pfVar19 + 4;
              lVar26 = lVar26 + 4;
            }
            lVar27 = sVar8 * (lVar16 + lVar27);
            auVar41._0_4_ = 0.0;
            for (; (int)lVar26 < iVar24; lVar26 = lVar26 + 1) {
              auVar41._0_4_ = auVar41._0_4_ + *(float *)((long)pvVar7 + lVar26 * 4 + lVar27);
            }
            if (iVar1 == 1) {
              auVar37._0_4_ = auVar37._0_4_ + auVar39._0_4_;
              auVar38._4_4_ = auVar37._0_4_;
              auVar38._0_4_ = auVar37._0_4_;
              auVar38._8_4_ = auVar37._0_4_;
              auVar38._12_4_ = auVar37._0_4_;
              auVar39._4_12_ = auVar38._4_12_;
              auVar39._0_4_ =
                   (auVar37._0_4_ + auVar36._0_4_ + auVar33._0_4_ + auVar41._0_4_) * fVar31;
              auVar40 = auVar39;
LAB_0047b9d3:
              auVar41._12_4_ = 0.0;
              auVar41._8_4_ = 0.0;
              auVar41._4_4_ = 0.0;
              auVar37._0_4_ = auVar40._0_4_;
              bVar15 = false;
              auVar41._0_4_ = auVar39._0_4_;
              auVar33._0_4_ = auVar37._0_4_;
              auVar39._0_4_ = auVar37._0_4_;
              auVar36._0_4_ = auVar37._0_4_;
            }
            else {
              if (iVar1 != 4) {
                auVar39._0_4_ = 0.0;
                auVar40 = ZEXT816(0);
                goto LAB_0047b9d3;
              }
              auVar41._0_4_ = auVar33._0_4_ * fVar31;
              auVar41._4_4_ = auVar39._0_4_ * fVar31;
              auVar41._8_4_ = auVar36._0_4_ * fVar31;
              auVar41._12_4_ = auVar37._0_4_ * fVar31;
              bVar15 = true;
              auVar37._0_4_ = auVar41._0_4_;
              auVar33._0_4_ = auVar41._4_4_;
              auVar39._0_4_ = auVar41._8_4_;
              auVar36._0_4_ = auVar41._12_4_;
              auVar40 = auVar41;
            }
            lVar16 = 0;
            auVar33._4_4_ = 0.0;
            auVar33._8_4_ = 0.0;
            auVar33._12_4_ = 0.0;
            auVar34._0_4_ = 0.0;
            iVar22 = 0;
            pfVar19 = pfVar20;
            while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
              auVar33._4_4_ =
                   auVar33._4_4_ + (*pfVar19 - auVar37._0_4_) * (*pfVar19 - auVar37._0_4_);
              auVar33._8_4_ =
                   auVar33._8_4_ + (pfVar19[1] - auVar33._0_4_) * (pfVar19[1] - auVar33._0_4_);
              auVar33._12_4_ =
                   auVar33._12_4_ + (pfVar19[2] - auVar39._0_4_) * (pfVar19[2] - auVar39._0_4_);
              auVar34._0_4_ =
                   auVar34._0_4_ + (pfVar19[3] - auVar36._0_4_) * (pfVar19[3] - auVar36._0_4_);
              pfVar19 = pfVar19 + 4;
              lVar16 = lVar16 + 4;
            }
            auVar37._0_4_ = 0.0;
            for (; (int)lVar16 < iVar24; lVar16 = lVar16 + 1) {
              auVar33._0_4_ = *(float *)((long)pvVar7 + lVar16 * 4 + lVar27) - auVar40._0_4_;
              auVar37._0_4_ = auVar37._0_4_ + auVar33._0_4_ * auVar33._0_4_;
            }
            if (bVar15) {
              auVar34._4_4_ = auVar33._4_4_ * fVar31;
              auVar33._0_4_ = auVar33._8_4_ * fVar31;
              auVar39._0_4_ = auVar33._12_4_ * fVar31;
              auVar36._0_4_ = auVar34._0_4_ * fVar31;
            }
            else {
              auVar34._4_4_ = 0.0;
              auVar33._0_4_ = 0.0;
              auVar39._0_4_ = 0.0;
              auVar36._0_4_ = 0.0;
            }
            if (iVar1 == 1) {
              auVar34._0_4_ = auVar34._0_4_ + auVar33._8_4_;
              auVar37._0_4_ =
                   (auVar34._0_4_ + auVar33._12_4_ + auVar33._4_4_ + auVar37._0_4_) * fVar31 +
                   fVar32;
              auVar13._4_4_ = auVar34._0_4_;
              auVar13._0_4_ = auVar37._0_4_;
              auVar13._8_4_ = auVar34._0_4_;
              auVar13._12_4_ = auVar34._0_4_;
              auVar42 = rsqrtss(ZEXT416((uint)fVar32),auVar13);
              fVar32 = auVar42._0_4_;
              auVar34._4_4_ = fVar32 * -0.5 * (auVar37._0_4_ * fVar32 * fVar32 + -3.0);
              auVar41._0_4_ = -auVar40._0_4_ * auVar34._4_4_;
            }
            else if (iVar1 == 4) {
              auVar10._4_4_ = auVar33._0_4_ + fVar32;
              auVar10._0_4_ = auVar34._4_4_ + fVar32;
              auVar10._8_4_ = auVar39._0_4_ + fVar32;
              auVar10._12_4_ = auVar36._0_4_ + fVar32;
              auVar37 = rsqrtps(auVar40,auVar10);
              auVar33._4_4_ = auVar37._4_4_;
              auVar33._8_4_ = auVar37._8_4_;
              auVar33._12_4_ = auVar37._12_4_;
              auVar34._4_4_ =
                   ((auVar34._4_4_ + fVar32) * auVar37._0_4_ * auVar37._0_4_ + -3.0) *
                   auVar37._0_4_ * -0.5;
              auVar33._0_4_ =
                   ((auVar33._0_4_ + fVar32) * auVar33._4_4_ * auVar33._4_4_ + -3.0) *
                   auVar33._4_4_ * -0.5;
              auVar39._0_4_ =
                   ((auVar39._0_4_ + fVar32) * auVar33._8_4_ * auVar33._8_4_ + -3.0) *
                   auVar33._8_4_ * -0.5;
              auVar36._0_4_ =
                   ((auVar36._0_4_ + fVar32) * auVar33._12_4_ * auVar33._12_4_ + -3.0) *
                   auVar33._12_4_ * -0.5;
              auVar41._0_4_ = -auVar41._0_4_ * auVar34._4_4_;
              auVar41._4_4_ = -auVar41._4_4_ * auVar33._0_4_;
              auVar41._8_4_ = -auVar41._8_4_ * auVar39._0_4_;
              auVar41._12_4_ = -auVar41._12_4_ * auVar36._0_4_;
            }
            if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
              if (!bVar15) {
                auVar33._0_4_ = auVar34._4_4_;
                auVar39._0_4_ = auVar34._4_4_;
                auVar36._0_4_ = auVar34._4_4_;
                auVar41._4_4_ = auVar41._0_4_;
                auVar41._8_4_ = auVar41._0_4_;
                auVar41._12_4_ = auVar41._0_4_;
              }
              lVar16 = 0;
              iVar22 = 0;
              while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
                *pfVar20 = *pfVar20 * auVar34._4_4_ + auVar41._0_4_;
                pfVar20[1] = pfVar20[1] * auVar33._0_4_ + auVar41._4_4_;
                pfVar20[2] = pfVar20[2] * auVar39._0_4_ + auVar41._8_4_;
                pfVar20[3] = pfVar20[3] * auVar36._0_4_ + auVar41._12_4_;
                pfVar20 = pfVar20 + 4;
                lVar16 = lVar16 + 4;
              }
              for (; (int)lVar16 < iVar24; lVar16 = lVar16 + 1) {
                *(float *)((long)pvVar7 + lVar16 * 4 + lVar27) =
                     *(float *)((long)pvVar7 + lVar16 * 4 + lVar27) * auVar34._4_4_ + auVar41._0_4_;
              }
            }
            else {
              pfVar19 = pfVar6;
              pfVar29 = pfVar5;
              if (bVar15) {
                for (iVar22 = 4; iVar22 <= iVar24; iVar22 = iVar22 + 4) {
                  fVar32 = *pfVar29;
                  auVar37._0_4_ = *pfVar19;
                  *pfVar20 = (*pfVar20 * auVar34._4_4_ + auVar41._0_4_) * fVar32 + auVar37._0_4_;
                  pfVar20[1] = (pfVar20[1] * auVar33._0_4_ + auVar41._4_4_) * fVar32 + auVar37._0_4_
                  ;
                  pfVar20[2] = (pfVar20[2] * auVar39._0_4_ + auVar41._8_4_) * fVar32 + auVar37._0_4_
                  ;
                  pfVar20[3] = (pfVar20[3] * auVar36._0_4_ + auVar41._12_4_) * fVar32 +
                               auVar37._0_4_;
                  pfVar20 = pfVar20 + 4;
                  pfVar29 = pfVar29 + 1;
                  pfVar19 = pfVar19 + 1;
                }
              }
              if (iVar1 == 1) {
                lVar27 = 0;
                iVar22 = 0;
                pfVar17 = pfVar19;
                pfVar21 = pfVar29;
                pfVar28 = pfVar20;
                while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
                  fVar32 = pfVar21[1];
                  auVar37._0_4_ = pfVar21[2];
                  auVar33._0_4_ = pfVar21[3];
                  auVar39._0_4_ = pfVar17[1];
                  auVar36._0_4_ = pfVar17[2];
                  auVar33._4_4_ = pfVar17[3];
                  *pfVar28 = (*pfVar28 * auVar34._4_4_ + auVar41._0_4_) * *pfVar21 + *pfVar17;
                  pfVar28[1] = (pfVar28[1] * auVar34._4_4_ + auVar41._0_4_) * fVar32 + auVar39._0_4_
                  ;
                  pfVar28[2] = (pfVar28[2] * auVar34._4_4_ + auVar41._0_4_) * auVar37._0_4_ +
                               auVar36._0_4_;
                  pfVar28[3] = (pfVar28[3] * auVar34._4_4_ + auVar41._0_4_) * auVar33._0_4_ +
                               auVar33._4_4_;
                  pfVar28 = pfVar28 + 4;
                  pfVar21 = pfVar21 + 4;
                  pfVar17 = pfVar17 + 4;
                  lVar27 = lVar27 + 4;
                }
                for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
                  pfVar20[lVar27] =
                       (pfVar20[lVar27] * auVar34._4_4_ + auVar41._0_4_) * pfVar29[lVar27] +
                       pfVar19[lVar27];
                }
              }
            }
          }
        }
      }
      else {
        iVar24 = uVar2 * iVar22 * iVar1;
        fVar31 = 1.0 / (float)(int)(uVar2 * iVar22);
        for (uVar25 = 0; uVar25 != uVar18; uVar25 = uVar25 + 1) {
          pvVar7 = bottom_top_blob->data;
          pfVar20 = (float *)(bottom_top_blob->cstep * uVar25 * bottom_top_blob->elemsize +
                             (long)pvVar7);
          fVar32 = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          lVar27 = 0;
          auVar33._0_4_ = 0.0;
          auVar39._0_4_ = 0.0;
          auVar36._0_4_ = 0.0;
          auVar37._0_4_ = 0.0;
          iVar22 = 0;
          pfVar19 = pfVar20;
          while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
            auVar33._0_4_ = auVar33._0_4_ + *pfVar19;
            auVar39._0_4_ = auVar39._0_4_ + pfVar19[1];
            auVar36._0_4_ = auVar36._0_4_ + pfVar19[2];
            auVar37._0_4_ = auVar37._0_4_ + pfVar19[3];
            pfVar19 = pfVar19 + 4;
            lVar27 = lVar27 + 4;
          }
          lVar16 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar25;
          auVar41._0_4_ = 0.0;
          for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
            auVar41._0_4_ = auVar41._0_4_ + *(float *)((long)pvVar7 + lVar27 * 4 + lVar16);
          }
          if (iVar1 == 1) {
            auVar37._0_4_ = auVar37._0_4_ + auVar39._0_4_;
            auVar42._4_4_ = auVar37._0_4_;
            auVar42._0_4_ = auVar37._0_4_;
            auVar42._8_4_ = auVar37._0_4_;
            auVar42._12_4_ = auVar37._0_4_;
            auVar37._4_12_ = auVar42._4_12_;
            auVar37._0_4_ = (auVar37._0_4_ + auVar36._0_4_ + auVar33._0_4_ + auVar41._0_4_) * fVar31
            ;
            auVar40 = auVar37;
LAB_0047beda:
            auVar33._12_4_ = 0.0;
            auVar33._8_4_ = 0.0;
            auVar33._4_4_ = 0.0;
            auVar39._0_4_ = auVar40._0_4_;
            bVar15 = false;
            auVar33._0_4_ = auVar37._0_4_;
            auVar37._0_4_ = auVar39._0_4_;
            auVar36._0_4_ = auVar39._0_4_;
            auVar41._0_4_ = auVar39._0_4_;
          }
          else {
            if (iVar1 != 4) {
              auVar37._0_4_ = 0.0;
              auVar40 = ZEXT816(0);
              goto LAB_0047beda;
            }
            auVar33._0_4_ = auVar33._0_4_ * fVar31;
            auVar33._4_4_ = auVar39._0_4_ * fVar31;
            auVar33._8_4_ = auVar36._0_4_ * fVar31;
            auVar33._12_4_ = auVar37._0_4_ * fVar31;
            bVar15 = true;
            auVar39._0_4_ = auVar33._0_4_;
            auVar37._0_4_ = auVar33._4_4_;
            auVar36._0_4_ = auVar33._8_4_;
            auVar41._0_4_ = auVar33._12_4_;
            auVar40 = auVar33;
          }
          lVar27 = 0;
          auVar41._4_4_ = 0.0;
          auVar41._8_4_ = 0.0;
          auVar41._12_4_ = 0.0;
          auVar34._0_4_ = 0.0;
          iVar22 = 0;
          pfVar19 = pfVar20;
          while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
            auVar41._4_4_ = auVar41._4_4_ + (*pfVar19 - auVar39._0_4_) * (*pfVar19 - auVar39._0_4_);
            auVar41._8_4_ =
                 auVar41._8_4_ + (pfVar19[1] - auVar37._0_4_) * (pfVar19[1] - auVar37._0_4_);
            auVar41._12_4_ =
                 auVar41._12_4_ + (pfVar19[2] - auVar36._0_4_) * (pfVar19[2] - auVar36._0_4_);
            auVar34._0_4_ =
                 auVar34._0_4_ + (pfVar19[3] - auVar41._0_4_) * (pfVar19[3] - auVar41._0_4_);
            pfVar19 = pfVar19 + 4;
            lVar27 = lVar27 + 4;
          }
          auVar37._0_4_ = 0.0;
          for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
            auVar39._0_4_ = *(float *)((long)pvVar7 + lVar27 * 4 + lVar16) - auVar40._0_4_;
            auVar37._0_4_ = auVar37._0_4_ + auVar39._0_4_ * auVar39._0_4_;
          }
          if (bVar15) {
            auVar34._4_4_ = auVar41._4_4_ * fVar31;
            auVar39._0_4_ = auVar41._8_4_ * fVar31;
            auVar36._0_4_ = auVar41._12_4_ * fVar31;
            auVar41._0_4_ = auVar34._0_4_ * fVar31;
          }
          else {
            auVar34._4_4_ = 0.0;
            auVar39._0_4_ = 0.0;
            auVar36._0_4_ = 0.0;
            auVar41._0_4_ = 0.0;
          }
          if (iVar1 == 1) {
            auVar34._0_4_ = auVar34._0_4_ + auVar41._8_4_;
            auVar37._0_4_ =
                 (auVar34._0_4_ + auVar41._12_4_ + auVar41._4_4_ + auVar37._0_4_) * fVar31 + fVar32;
            auVar14._4_4_ = auVar34._0_4_;
            auVar14._0_4_ = auVar37._0_4_;
            auVar14._8_4_ = auVar34._0_4_;
            auVar14._12_4_ = auVar34._0_4_;
            auVar42 = rsqrtss(ZEXT416((uint)fVar32),auVar14);
            fVar32 = auVar42._0_4_;
            auVar34._4_4_ = fVar32 * -0.5 * (auVar37._0_4_ * fVar32 * fVar32 + -3.0);
            auVar33._0_4_ = -auVar40._0_4_ * auVar34._4_4_;
          }
          else if (iVar1 == 4) {
            auVar11._4_4_ = auVar39._0_4_ + fVar32;
            auVar11._0_4_ = auVar34._4_4_ + fVar32;
            auVar11._8_4_ = auVar36._0_4_ + fVar32;
            auVar11._12_4_ = auVar41._0_4_ + fVar32;
            auVar37 = rsqrtps(auVar40,auVar11);
            auVar41._4_4_ = auVar37._4_4_;
            auVar41._8_4_ = auVar37._8_4_;
            auVar41._12_4_ = auVar37._12_4_;
            auVar34._4_4_ =
                 ((auVar34._4_4_ + fVar32) * auVar37._0_4_ * auVar37._0_4_ + -3.0) *
                 auVar37._0_4_ * -0.5;
            auVar39._0_4_ =
                 ((auVar39._0_4_ + fVar32) * auVar41._4_4_ * auVar41._4_4_ + -3.0) *
                 auVar41._4_4_ * -0.5;
            auVar36._0_4_ =
                 ((auVar36._0_4_ + fVar32) * auVar41._8_4_ * auVar41._8_4_ + -3.0) *
                 auVar41._8_4_ * -0.5;
            auVar41._0_4_ =
                 ((auVar41._0_4_ + fVar32) * auVar41._12_4_ * auVar41._12_4_ + -3.0) *
                 auVar41._12_4_ * -0.5;
            auVar33._0_4_ = -auVar33._0_4_ * auVar34._4_4_;
            auVar33._4_4_ = -auVar33._4_4_ * auVar39._0_4_;
            auVar33._8_4_ = -auVar33._8_4_ * auVar36._0_4_;
            auVar33._12_4_ = -auVar33._12_4_ * auVar41._0_4_;
          }
          if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
            if (!bVar15) {
              auVar39._0_4_ = auVar34._4_4_;
              auVar36._0_4_ = auVar34._4_4_;
              auVar41._0_4_ = auVar34._4_4_;
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
            }
            lVar27 = 0;
            iVar22 = 0;
            while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
              *pfVar20 = *pfVar20 * auVar34._4_4_ + auVar33._0_4_;
              pfVar20[1] = pfVar20[1] * auVar39._0_4_ + auVar33._4_4_;
              pfVar20[2] = pfVar20[2] * auVar36._0_4_ + auVar33._8_4_;
              pfVar20[3] = pfVar20[3] * auVar41._0_4_ + auVar33._12_4_;
              pfVar20 = pfVar20 + 4;
              lVar27 = lVar27 + 4;
            }
            for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
              *(float *)((long)pvVar7 + lVar27 * 4 + lVar16) =
                   *(float *)((long)pvVar7 + lVar27 * 4 + lVar16) * auVar34._4_4_ + auVar33._0_4_;
            }
          }
          else {
            pfVar19 = pfVar6;
            pfVar29 = pfVar5;
            if (bVar15) {
              for (iVar22 = 4; iVar22 <= iVar24; iVar22 = iVar22 + 4) {
                fVar32 = *pfVar29;
                auVar37._0_4_ = *pfVar19;
                *pfVar20 = (*pfVar20 * auVar34._4_4_ + auVar33._0_4_) * fVar32 + auVar37._0_4_;
                pfVar20[1] = (pfVar20[1] * auVar39._0_4_ + auVar33._4_4_) * fVar32 + auVar37._0_4_;
                pfVar20[2] = (pfVar20[2] * auVar36._0_4_ + auVar33._8_4_) * fVar32 + auVar37._0_4_;
                pfVar20[3] = (pfVar20[3] * auVar41._0_4_ + auVar33._12_4_) * fVar32 + auVar37._0_4_;
                pfVar20 = pfVar20 + 4;
                pfVar29 = pfVar29 + 1;
                pfVar19 = pfVar19 + 1;
              }
            }
            if (iVar1 == 1) {
              lVar27 = 0;
              iVar22 = 0;
              pfVar17 = pfVar19;
              pfVar21 = pfVar20;
              pfVar28 = pfVar29;
              while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
                fVar32 = pfVar28[1];
                auVar37._0_4_ = pfVar28[2];
                auVar39._0_4_ = pfVar28[3];
                auVar36._0_4_ = pfVar17[1];
                auVar41._0_4_ = pfVar17[2];
                auVar33._4_4_ = pfVar17[3];
                *pfVar21 = (*pfVar21 * auVar34._4_4_ + auVar33._0_4_) * *pfVar28 + *pfVar17;
                pfVar21[1] = (pfVar21[1] * auVar34._4_4_ + auVar33._0_4_) * fVar32 + auVar36._0_4_;
                pfVar21[2] = (pfVar21[2] * auVar34._4_4_ + auVar33._0_4_) * auVar37._0_4_ +
                             auVar41._0_4_;
                pfVar21[3] = (pfVar21[3] * auVar34._4_4_ + auVar33._0_4_) * auVar39._0_4_ +
                             auVar33._4_4_;
                pfVar21 = pfVar21 + 4;
                pfVar28 = pfVar28 + 4;
                pfVar17 = pfVar17 + 4;
                lVar27 = lVar27 + 4;
              }
              for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
                pfVar20[lVar27] =
                     (pfVar20[lVar27] * auVar34._4_4_ + auVar33._0_4_) * pfVar29[lVar27] +
                     pfVar19[lVar27];
              }
            }
          }
        }
      }
    }
    else if (iVar24 == 2) {
      iVar24 = iVar22 * iVar1;
      fVar31 = 1.0 / (float)iVar22;
      uVar25 = 0;
      uVar18 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar18 = uVar25;
      }
      for (; uVar25 != uVar18; uVar25 = uVar25 + 1) {
        pvVar7 = bottom_top_blob->data;
        pfVar20 = (float *)(uVar25 * (long)bottom_top_blob->w * bottom_top_blob->elemsize +
                           (long)pvVar7);
        fVar32 = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
        lVar27 = 0;
        auVar33._0_4_ = 0.0;
        auVar39._0_4_ = 0.0;
        auVar36._0_4_ = 0.0;
        auVar37._0_4_ = 0.0;
        iVar22 = 0;
        pfVar19 = pfVar20;
        while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
          auVar33._0_4_ = auVar33._0_4_ + *pfVar19;
          auVar39._0_4_ = auVar39._0_4_ + pfVar19[1];
          auVar36._0_4_ = auVar36._0_4_ + pfVar19[2];
          auVar37._0_4_ = auVar37._0_4_ + pfVar19[3];
          pfVar19 = pfVar19 + 4;
          lVar27 = lVar27 + 4;
        }
        lVar16 = bottom_top_blob->elemsize * uVar25 * (long)bottom_top_blob->w;
        auVar41._0_4_ = 0.0;
        for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
          auVar41._0_4_ = auVar41._0_4_ + *(float *)((long)pvVar7 + lVar27 * 4 + lVar16);
        }
        if (iVar1 == 1) {
          auVar37._0_4_ = auVar37._0_4_ + auVar39._0_4_;
          auVar35._4_4_ = auVar37._0_4_;
          auVar35._0_4_ = auVar37._0_4_;
          auVar35._8_4_ = auVar37._0_4_;
          auVar35._12_4_ = auVar37._0_4_;
          auVar36._4_12_ = auVar35._4_12_;
          auVar36._0_4_ = (auVar37._0_4_ + auVar36._0_4_ + auVar33._0_4_ + auVar41._0_4_) * fVar31;
          auVar40 = auVar36;
LAB_0047b605:
          auVar34._12_4_ = 0.0;
          auVar34._8_4_ = 0.0;
          auVar34._4_4_ = 0.0;
          auVar37._0_4_ = auVar40._0_4_;
          bVar15 = false;
          auVar34._0_4_ = auVar36._0_4_;
          auVar33._0_4_ = auVar37._0_4_;
          auVar39._0_4_ = auVar37._0_4_;
          auVar36._0_4_ = auVar37._0_4_;
        }
        else {
          if (iVar1 != 4) {
            auVar36._0_4_ = 0.0;
            auVar40 = ZEXT816(0);
            goto LAB_0047b605;
          }
          auVar34._0_4_ = auVar33._0_4_ * fVar31;
          auVar34._4_4_ = auVar39._0_4_ * fVar31;
          auVar34._8_4_ = auVar36._0_4_ * fVar31;
          auVar34._12_4_ = auVar37._0_4_ * fVar31;
          bVar15 = true;
          auVar37._0_4_ = auVar34._0_4_;
          auVar33._0_4_ = auVar34._4_4_;
          auVar39._0_4_ = auVar34._8_4_;
          auVar36._0_4_ = auVar34._12_4_;
          auVar40 = auVar34;
        }
        lVar27 = 0;
        auVar41._0_4_ = 0.0;
        auVar33._4_4_ = 0.0;
        auVar33._8_4_ = 0.0;
        auVar33._12_4_ = 0.0;
        iVar22 = 0;
        pfVar19 = pfVar20;
        while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
          auVar41._0_4_ = auVar41._0_4_ + (*pfVar19 - auVar37._0_4_) * (*pfVar19 - auVar37._0_4_);
          auVar33._4_4_ =
               auVar33._4_4_ + (pfVar19[1] - auVar33._0_4_) * (pfVar19[1] - auVar33._0_4_);
          auVar33._8_4_ =
               auVar33._8_4_ + (pfVar19[2] - auVar39._0_4_) * (pfVar19[2] - auVar39._0_4_);
          auVar33._12_4_ =
               auVar33._12_4_ + (pfVar19[3] - auVar36._0_4_) * (pfVar19[3] - auVar36._0_4_);
          pfVar19 = pfVar19 + 4;
          lVar27 = lVar27 + 4;
        }
        auVar37._0_4_ = 0.0;
        for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
          auVar33._0_4_ = *(float *)((long)pvVar7 + lVar27 * 4 + lVar16) - auVar40._0_4_;
          auVar37._0_4_ = auVar37._0_4_ + auVar33._0_4_ * auVar33._0_4_;
        }
        if (bVar15) {
          auVar41._4_4_ = auVar41._0_4_ * fVar31;
          auVar33._0_4_ = auVar33._4_4_ * fVar31;
          auVar39._0_4_ = auVar33._8_4_ * fVar31;
          auVar36._0_4_ = auVar33._12_4_ * fVar31;
        }
        else {
          auVar41._4_4_ = 0.0;
          auVar33._0_4_ = 0.0;
          auVar39._0_4_ = 0.0;
          auVar36._0_4_ = 0.0;
        }
        if (iVar1 == 1) {
          auVar33._12_4_ = auVar33._12_4_ + auVar33._4_4_;
          auVar37._0_4_ =
               (auVar33._12_4_ + auVar33._8_4_ + auVar41._0_4_ + auVar37._0_4_) * fVar31 + fVar32;
          auVar12._4_4_ = auVar33._12_4_;
          auVar12._0_4_ = auVar37._0_4_;
          auVar12._8_4_ = auVar33._12_4_;
          auVar12._12_4_ = auVar33._12_4_;
          auVar41 = rsqrtss(ZEXT416((uint)fVar32),auVar12);
          fVar32 = auVar41._0_4_;
          auVar41._4_4_ = fVar32 * -0.5 * (auVar37._0_4_ * fVar32 * fVar32 + -3.0);
          auVar34._0_4_ = -auVar40._0_4_ * auVar41._4_4_;
        }
        else if (iVar1 == 4) {
          auVar9._4_4_ = auVar33._0_4_ + fVar32;
          auVar9._0_4_ = auVar41._4_4_ + fVar32;
          auVar9._8_4_ = auVar39._0_4_ + fVar32;
          auVar9._12_4_ = auVar36._0_4_ + fVar32;
          auVar37 = rsqrtps(auVar40,auVar9);
          auVar41._0_4_ = auVar37._4_4_;
          auVar33._4_4_ = auVar37._8_4_;
          auVar33._8_4_ = auVar37._12_4_;
          auVar41._4_4_ =
               ((auVar41._4_4_ + fVar32) * auVar37._0_4_ * auVar37._0_4_ + -3.0) *
               auVar37._0_4_ * -0.5;
          auVar33._0_4_ =
               ((auVar33._0_4_ + fVar32) * auVar41._0_4_ * auVar41._0_4_ + -3.0) *
               auVar41._0_4_ * -0.5;
          auVar39._0_4_ =
               ((auVar39._0_4_ + fVar32) * auVar33._4_4_ * auVar33._4_4_ + -3.0) *
               auVar33._4_4_ * -0.5;
          auVar36._0_4_ =
               ((auVar36._0_4_ + fVar32) * auVar33._8_4_ * auVar33._8_4_ + -3.0) *
               auVar33._8_4_ * -0.5;
          auVar34._0_4_ = -auVar34._0_4_ * auVar41._4_4_;
          auVar34._4_4_ = -auVar34._4_4_ * auVar33._0_4_;
          auVar34._8_4_ = -auVar34._8_4_ * auVar39._0_4_;
          auVar34._12_4_ = -auVar34._12_4_ * auVar36._0_4_;
        }
        if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
          if (!bVar15) {
            auVar33._0_4_ = auVar41._4_4_;
            auVar39._0_4_ = auVar41._4_4_;
            auVar36._0_4_ = auVar41._4_4_;
            auVar34._4_4_ = auVar34._0_4_;
            auVar34._8_4_ = auVar34._0_4_;
            auVar34._12_4_ = auVar34._0_4_;
          }
          lVar27 = 0;
          iVar22 = 0;
          while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
            *pfVar20 = *pfVar20 * auVar41._4_4_ + auVar34._0_4_;
            pfVar20[1] = pfVar20[1] * auVar33._0_4_ + auVar34._4_4_;
            pfVar20[2] = pfVar20[2] * auVar39._0_4_ + auVar34._8_4_;
            pfVar20[3] = pfVar20[3] * auVar36._0_4_ + auVar34._12_4_;
            pfVar20 = pfVar20 + 4;
            lVar27 = lVar27 + 4;
          }
          for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
            *(float *)((long)pvVar7 + lVar27 * 4 + lVar16) =
                 *(float *)((long)pvVar7 + lVar27 * 4 + lVar16) * auVar41._4_4_ + auVar34._0_4_;
          }
        }
        else {
          pfVar19 = pfVar5;
          pfVar29 = pfVar6;
          if (bVar15) {
            for (iVar22 = 4; iVar22 <= iVar24; iVar22 = iVar22 + 4) {
              fVar32 = *pfVar19;
              auVar37._0_4_ = *pfVar29;
              *pfVar20 = (*pfVar20 * auVar41._4_4_ + auVar34._0_4_) * fVar32 + auVar37._0_4_;
              pfVar20[1] = (pfVar20[1] * auVar33._0_4_ + auVar34._4_4_) * fVar32 + auVar37._0_4_;
              pfVar20[2] = (pfVar20[2] * auVar39._0_4_ + auVar34._8_4_) * fVar32 + auVar37._0_4_;
              pfVar20[3] = (pfVar20[3] * auVar36._0_4_ + auVar34._12_4_) * fVar32 + auVar37._0_4_;
              pfVar20 = pfVar20 + 4;
              pfVar19 = pfVar19 + 1;
              pfVar29 = pfVar29 + 1;
            }
          }
          if (iVar1 == 1) {
            lVar27 = 0;
            iVar22 = 0;
            pfVar17 = pfVar29;
            pfVar21 = pfVar19;
            pfVar28 = pfVar20;
            while (iVar22 = iVar22 + 4, iVar22 <= iVar24) {
              fVar32 = pfVar21[1];
              auVar37._0_4_ = pfVar21[2];
              auVar33._0_4_ = pfVar21[3];
              auVar39._0_4_ = pfVar17[1];
              auVar36._0_4_ = pfVar17[2];
              auVar41._0_4_ = pfVar17[3];
              *pfVar28 = (*pfVar28 * auVar41._4_4_ + auVar34._0_4_) * *pfVar21 + *pfVar17;
              pfVar28[1] = (pfVar28[1] * auVar41._4_4_ + auVar34._0_4_) * fVar32 + auVar39._0_4_;
              pfVar28[2] = (pfVar28[2] * auVar41._4_4_ + auVar34._0_4_) * auVar37._0_4_ +
                           auVar36._0_4_;
              pfVar28[3] = (pfVar28[3] * auVar41._4_4_ + auVar34._0_4_) * auVar33._0_4_ +
                           auVar41._0_4_;
              pfVar28 = pfVar28 + 4;
              pfVar21 = pfVar21 + 4;
              pfVar17 = pfVar17 + 4;
              lVar27 = lVar27 + 4;
            }
            for (; (int)lVar27 < iVar24; lVar27 = lVar27 + 1) {
              pfVar20[lVar27] =
                   (pfVar20[lVar27] * auVar41._4_4_ + auVar34._0_4_) * pfVar19[lVar27] +
                   pfVar29[lVar27];
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}